

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O2

bool TryCreateDirectories(path *p)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::filesystem::is_symlink(&p->super_path);
  if (bVar2) {
    bVar2 = std::filesystem::is_directory(&p->super_path);
    if (bVar2) {
      uVar3 = 0;
      goto LAB_00142649;
    }
  }
  uVar3 = std::filesystem::create_directories(&p->super_path);
LAB_00142649:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool TryCreateDirectories(const fs::path& p)
{
    try {
        return fs::create_directories(p);
    } catch (const fs::filesystem_error&) {
        if (!fs::exists(p) || !fs::is_directory(p))
            throw;
    }

    // create_directories didn't create the directory, it had to have existed already
    return false;
}